

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UA_Client_Subscriptions_manuallySendPublishRequest(UA_Client *client)

{
  UA_PublishRequest request_00;
  undefined1 local_198 [8];
  UA_PublishResponse response;
  UA_Client_NotificationsAckNumber *pUStack_a8;
  int i;
  UA_Client_NotificationsAckNumber *ack;
  UA_PublishRequest request;
  UA_Boolean moreNotifications;
  UA_Client *client_local;
  
  if (client->state == UA_CLIENTSTATE_ERRORED) {
    client_local._4_4_ = 0x800d0000;
  }
  else {
    request.subscriptionAcknowledgements._7_1_ = 1;
    while ((request.subscriptionAcknowledgements._7_1_ & 1) != 0) {
      UA_PublishRequest_init((UA_PublishRequest *)&ack);
      request.requestHeader.additionalHeader.content.encoded.body.data = (UA_Byte *)0x0;
      for (pUStack_a8 = (client->pendingNotificationsAcks).lh_first;
          pUStack_a8 != (UA_Client_NotificationsAckNumber *)0x0;
          pUStack_a8 = (pUStack_a8->listEntry).le_next) {
        request.requestHeader.additionalHeader.content.encoded.body.data =
             request.requestHeader.additionalHeader.content.encoded.body.data + 1;
      }
      if ((request.requestHeader.additionalHeader.content.encoded.body.data != (UA_Byte *)0x0) &&
         (request.subscriptionAcknowledgementsSize =
               (size_t)malloc((long)request.requestHeader.additionalHeader.content.encoded.body.data
                              << 3), (void *)request.subscriptionAcknowledgementsSize == (void *)0x0
         )) {
        return 0;
      }
      response.diagnosticInfos._4_4_ = 0;
      for (pUStack_a8 = (client->pendingNotificationsAcks).lh_first;
          pUStack_a8 != (UA_Client_NotificationsAckNumber *)0x0;
          pUStack_a8 = (pUStack_a8->listEntry).le_next) {
        *(UA_UInt32 *)
         (request.subscriptionAcknowledgementsSize + 4 + (long)response.diagnosticInfos._4_4_ * 8) =
             (pUStack_a8->subAck).sequenceNumber;
        *(UA_UInt32 *)
         (request.subscriptionAcknowledgementsSize + (long)response.diagnosticInfos._4_4_ * 8) =
             (pUStack_a8->subAck).subscriptionId;
        response.diagnosticInfos._4_4_ = response.diagnosticInfos._4_4_ + 1;
      }
      request_00.requestHeader.authenticationToken.identifier._0_2_ =
           request.requestHeader.authenticationToken.namespaceIndex;
      request_00.requestHeader.authenticationToken.identifier._2_2_ =
           request.requestHeader.authenticationToken._2_2_;
      request_00.requestHeader.authenticationToken.identifier._4_4_ =
           request.requestHeader.authenticationToken.identifierType;
      request_00.requestHeader.authenticationToken._0_8_ = ack;
      request_00.requestHeader.authenticationToken.identifier.string.data =
           (UA_Byte *)request.requestHeader.authenticationToken.identifier.string.length;
      request_00.requestHeader.timestamp =
           (UA_DateTime)request.requestHeader.authenticationToken.identifier.string.data;
      request_00.requestHeader.requestHandle = (undefined4)request.requestHeader.timestamp;
      request_00.requestHeader.returnDiagnostics = request.requestHeader.timestamp._4_4_;
      request_00.requestHeader.auditEntryId.length._0_4_ = request.requestHeader.requestHandle;
      request_00.requestHeader.auditEntryId.length._4_4_ = request.requestHeader.returnDiagnostics;
      request_00.requestHeader.auditEntryId.data =
           (UA_Byte *)request.requestHeader.auditEntryId.length;
      request_00.requestHeader._56_8_ = request.requestHeader.auditEntryId.data;
      request_00.requestHeader.additionalHeader.encoding = request.requestHeader.timeoutHint;
      request_00.requestHeader.additionalHeader._4_4_ = request.requestHeader._60_4_;
      request_00.requestHeader.additionalHeader.content.decoded.type =
           (UA_DataType *)request.requestHeader.additionalHeader._0_8_;
      request_00.requestHeader.additionalHeader.content.decoded.data =
           request.requestHeader.additionalHeader.content.decoded.type;
      request_00.requestHeader.additionalHeader.content._16_8_ =
           request.requestHeader.additionalHeader.content.decoded.data;
      request_00.requestHeader.additionalHeader.content.encoded.body.length =
           request.requestHeader.additionalHeader.content._16_8_;
      request_00.requestHeader.additionalHeader.content.encoded.body.data =
           (UA_Byte *)request.requestHeader.additionalHeader.content.encoded.body.length;
      request_00.subscriptionAcknowledgementsSize =
           (size_t)request.requestHeader.additionalHeader.content.encoded.body.data;
      request_00.subscriptionAcknowledgements =
           (UA_SubscriptionAcknowledgement *)request.subscriptionAcknowledgementsSize;
      UA_Client_Service_publish((UA_PublishResponse *)local_198,client,request_00);
      UA_Client_processPublishResponse
                (client,(UA_PublishRequest *)&ack,(UA_PublishResponse *)local_198);
      request.subscriptionAcknowledgements._7_1_ = (byte)response.availableSequenceNumbers & 1;
      UA_PublishResponse_deleteMembers((UA_PublishResponse *)local_198);
      UA_PublishRequest_deleteMembers((UA_PublishRequest *)&ack);
    }
    client_local._4_4_ = 0;
  }
  return client_local._4_4_;
}

Assistant:

UA_StatusCode
UA_Client_Subscriptions_manuallySendPublishRequest(UA_Client *client) {
    if (client->state == UA_CLIENTSTATE_ERRORED)
        return UA_STATUSCODE_BADSERVERNOTCONNECTED;

    UA_Boolean moreNotifications = true;
    while(moreNotifications) {
        UA_PublishRequest request;
        UA_PublishRequest_init(&request);
        request.subscriptionAcknowledgementsSize = 0;

        UA_Client_NotificationsAckNumber *ack;
        LIST_FOREACH(ack, &client->pendingNotificationsAcks, listEntry)
            ++request.subscriptionAcknowledgementsSize;
        if(request.subscriptionAcknowledgementsSize > 0) {
            request.subscriptionAcknowledgements =
                UA_malloc(sizeof(UA_SubscriptionAcknowledgement) * request.subscriptionAcknowledgementsSize);
            if(!request.subscriptionAcknowledgements)
                return UA_STATUSCODE_GOOD;
        }

        int i = 0;
        LIST_FOREACH(ack, &client->pendingNotificationsAcks, listEntry) {
            request.subscriptionAcknowledgements[i].sequenceNumber = ack->subAck.sequenceNumber;
            request.subscriptionAcknowledgements[i].subscriptionId = ack->subAck.subscriptionId;
            ++i;
        }

        UA_PublishResponse response = UA_Client_Service_publish(client, request);
        UA_Client_processPublishResponse(client, &request, &response);
        moreNotifications = response.moreNotifications;

        UA_PublishResponse_deleteMembers(&response);
        UA_PublishRequest_deleteMembers(&request);
    }
    return UA_STATUSCODE_GOOD;
}